

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

bool __thiscall
testing::internal::CartesianProductGenerator<int,_bool>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::AtEnd
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this)

{
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> _Var1;
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
  _Var2;
  undefined1 uVar3;
  int iVar4;
  
  _Var1._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
       .super__Head_base<0UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
       .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl;
  if (_Var1._M_head_impl !=
      ((ParamIteratorInterface<int> *)
      (this->end_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
      .super__Head_base<0UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>)._M_head_impl)
  {
    iVar4 = (*(_Var1._M_head_impl)->_vptr_ParamIteratorInterface[6])();
    if ((char)iVar4 == '\0') {
      _Var2._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_false>._M_head_impl
           = (this->current_).
             super__Tuple_impl<0UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
             .super__Tuple_impl<1UL,_testing::internal::ParamIterator<bool>_>.
             super__Head_base<1UL,_testing::internal::ParamIterator<bool>,_false>._M_head_impl.impl_
             ._M_t.
             super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
             ._M_t;
      if ((_Head_base<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_false>)
          _Var2._M_t.
          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
          .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_false>.
          _M_head_impl !=
          (_Head_base<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_false>)
          *(_Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
            *)&(this->end_).
               super__Tuple_impl<0UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<bool>_>
               .super__Tuple_impl<1UL,_testing::internal::ParamIterator<bool>_>.
               super__Head_base<1UL,_testing::internal::ParamIterator<bool>,_false>._M_head_impl.
               impl_._M_t.
               super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
         ) {
        uVar3 = (**(code **)(*(long *)_Var2._M_t.
                                      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
                                      .
                                      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_false>
                                      ._M_head_impl + 0x30))();
        return (bool)uVar3;
      }
    }
  }
  return true;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }